

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O1

int lyb_print_data(lyout *out,lyd_node *root,int options)

{
  lys_submodule *plVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  lys_module **pplVar5;
  int iVar6;
  int iVar7;
  lys_module *plVar8;
  lys_node *plVar9;
  lys_module *plVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  lyd_node *plVar14;
  ulong uVar15;
  long lVar16;
  undefined1 auStack_b8 [8];
  lyb_state lybs;
  uint8_t byte;
  hash_table *top_sibling_ht;
  size_t local_58;
  size_t mod_count;
  uint local_44;
  lys_module **local_40;
  lys_module **models;
  uint8_t zero;
  
  models._7_1_ = 0;
  _byte = (hash_table *)0x0;
  lybs.sib_ht = (anon_struct_16_2_515384b0 *)0x0;
  lybs.mod_count = 0;
  lybs._44_4_ = 0;
  lybs.ctx = (ly_ctx *)0x0;
  lybs.used = 0;
  lybs.size = 0;
  lybs.models = (lys_module **)0x0;
  lybs.position = (size_t *)0x0;
  lybs.inner_chunks = (uint8_t *)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  lybs.written = (size_t *)0x0;
  mod_count = (size_t)root;
  if (root != (lyd_node *)0x0) {
    plVar8 = lyd_node_module(root);
    lybs._40_8_ = plVar8->ctx;
    plVar9 = root->schema;
    do {
      plVar9 = lys_parent(plVar9);
      if (plVar9 == (lys_node *)0x0) goto LAB_0019e0fc;
    } while (plVar9->nodetype == LYS_USES);
    if (plVar9->nodetype != LYS_EXT) {
      ly_log((ly_ctx *)lybs._40_8_,LY_LLERR,LY_EINVAL,
             "LYB printer supports only printing top-level nodes.");
      return 1;
    }
  }
LAB_0019e0fc:
  lybs.sib_ht_count._0_3_ = 0x62796c;
  iVar6 = ly_write(out,(char *)&lybs.sib_ht_count,3);
  local_44 = 1;
  if (-1 < iVar6) {
    lybs._64_8_ = lybs._64_8_ & 0xffffffffffffff00;
    iVar6 = ly_write(out,(char *)&lybs.sib_ht_count,1);
    if (-1 < iVar6) {
      local_40 = (lys_module **)0x0;
      local_58 = 0;
      top_sibling_ht._4_4_ = 0;
      top_sibling_ht._0_4_ = options;
      if (mod_count != 0) {
        plVar14 = (lyd_node *)mod_count;
        do {
          plVar8 = lyd_node_module(plVar14);
          add_model(&local_40,&local_58,plVar8);
          sVar4 = mod_count;
          plVar14 = plVar14->next;
        } while (plVar14 != (lyd_node *)0x0);
        top_sibling_ht._4_4_ =
             ly_ctx_internal_modules_count((ly_ctx *)**(undefined8 **)(*(long *)mod_count + 0x30));
        plVar8 = ly_ctx_get_module_iter
                           ((ly_ctx *)**(undefined8 **)(*(long *)sVar4 + 0x30),
                            (uint32_t *)((long)&top_sibling_ht + 4));
        if (plVar8 != (lys_module *)0x0) {
LAB_0019e1c6:
          pplVar5 = local_40;
          sVar4 = local_58;
          if ((plVar8->field_0x40 & 0x80) != 0) {
            if (plVar8->deviation_size != '\0') {
              uVar15 = 0;
              do {
                plVar9 = plVar8->deviation[uVar15].orig_node;
                if ((plVar9 != (lys_node *)0x0) && (plVar10 = lys_node_module(plVar9), sVar4 != 0))
                {
                  uVar11 = 0;
                  do {
                    if (pplVar5[uVar11] == plVar10) goto LAB_0019e340;
                    uVar11 = uVar11 + 1;
                  } while (sVar4 != uVar11);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < plVar8->deviation_size);
            }
            pplVar5 = local_40;
            sVar4 = local_58;
            if (plVar8->augment_size != '\0') {
              uVar15 = 0;
              do {
                plVar10 = lys_node_module(plVar8->augment[uVar15].target);
                if (sVar4 != 0) {
                  uVar11 = 0;
                  do {
                    if (pplVar5[uVar11] == plVar10) goto LAB_0019e340;
                    uVar11 = uVar11 + 1;
                  } while (sVar4 != uVar11);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < plVar8->augment_size);
            }
            pplVar5 = local_40;
            sVar4 = local_58;
            if (plVar8->inc_size != '\0') {
              uVar15 = 0;
              do {
                plVar1 = plVar8->inc[uVar15].submodule;
                if (plVar1->deviation_size != '\0') {
                  uVar11 = 0;
                  do {
                    plVar9 = plVar1->deviation[uVar11].orig_node;
                    if ((plVar9 != (lys_node *)0x0) &&
                       (plVar10 = lys_node_module(plVar9), sVar4 != 0)) {
                      uVar12 = 0;
                      do {
                        if (pplVar5[uVar12] == plVar10) goto LAB_0019e340;
                        uVar12 = uVar12 + 1;
                      } while (sVar4 != uVar12);
                    }
                    uVar11 = uVar11 + 1;
                  } while (uVar11 < plVar1->deviation_size);
                }
                if (plVar1->augment_size != '\0') {
                  uVar11 = 0;
                  do {
                    plVar10 = lys_node_module(plVar1->augment[uVar11].target);
                    if (sVar4 != 0) {
                      uVar12 = 0;
                      do {
                        if (pplVar5[uVar12] == plVar10) goto LAB_0019e340;
                        uVar12 = uVar12 + 1;
                      } while (sVar4 != uVar12);
                    }
                    uVar11 = uVar11 + 1;
                  } while (uVar11 < plVar1->augment_size);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < plVar8->inc_size);
            }
          }
          goto LAB_0019e350;
        }
      }
LAB_0019e373:
      sVar4 = local_58;
      lybs._64_8_ = local_58;
      iVar6 = lyb_write(out,(uint8_t *)&lybs.sib_ht_count,2,(lyb_state *)auStack_b8);
      pplVar5 = local_40;
      if (sVar4 != 0) {
        uVar15 = 0;
        uVar11 = 1;
        do {
          iVar7 = lyb_print_model(out,pplVar5[uVar15],(lyb_state *)auStack_b8);
          iVar6 = iVar6 + iVar7;
          bVar2 = uVar11 < sVar4;
          uVar15 = uVar11;
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (bVar2);
      }
      free(local_40);
      uVar3 = (uint)top_sibling_ht;
      if (-1 < iVar6) {
        if (mod_count != 0) {
          plVar8 = (lys_module *)0x0;
          plVar14 = (lyd_node *)mod_count;
          do {
            plVar10 = lyd_node_module(plVar14);
            if (plVar10 != plVar8) {
              _byte = (hash_table *)0x0;
              plVar8 = lyd_node_module(plVar14);
            }
            local_44 = 1;
            iVar6 = lyb_print_subtree(out,plVar14,(hash_table **)&byte,(lyb_state *)auStack_b8,1);
            if (iVar6 < 0) goto LAB_0019e468;
          } while (((uVar3 & 1) != 0) && (plVar14 = plVar14->next, plVar14 != (lyd_node *)0x0));
        }
        local_44 = lyb_write(out,(uint8_t *)((long)&models + 7),1,(lyb_state *)auStack_b8);
        local_44 = local_44 >> 0x1f;
      }
    }
  }
LAB_0019e468:
  free((void *)auStack_b8);
  free(lybs.written);
  free(lybs.position);
  if (0 < (int)lybs.sib_ht) {
    lVar13 = 8;
    lVar16 = 0;
    do {
      lyht_free(*(hash_table **)((long)&((lybs.ctx)->dict).hash_tab + lVar13));
      lVar16 = lVar16 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar16 < (int)lybs.sib_ht);
  }
  free(lybs.ctx);
  return local_44;
LAB_0019e340:
  add_model(&local_40,&local_58,plVar8);
LAB_0019e350:
  plVar8 = ly_ctx_get_module_iter
                     ((ly_ctx *)**(undefined8 **)(*(long *)mod_count + 0x30),
                      (uint32_t *)((long)&top_sibling_ht + 4));
  if (plVar8 == (lys_module *)0x0) goto LAB_0019e373;
  goto LAB_0019e1c6;
}

Assistant:

int
lyb_print_data(struct lyout *out, const struct lyd_node *root, int options)
{
    int r, ret = 0, rc = EXIT_SUCCESS;
    uint8_t zero = 0;
    struct hash_table *top_sibling_ht = NULL;
    const struct lys_module *prev_mod = NULL;
    struct lys_node *parent;
    struct lyb_state lybs;

    memset(&lybs, 0, sizeof lybs);

    if (root) {
        lybs.ctx = lyd_node_module(root)->ctx;

        for (parent = lys_parent(root->schema); parent && (parent->nodetype == LYS_USES); parent = lys_parent(parent));
        if (parent && (parent->nodetype != LYS_EXT)) {
            LOGERR(lybs.ctx, LY_EINVAL, "LYB printer supports only printing top-level nodes.");
            return EXIT_FAILURE;
        }
    }

    /* LYB magic number */
    ret += (r = lyb_print_magic_number(out));
    if (r < 0) {
        rc = EXIT_FAILURE;
        goto finish;
    }

    /* LYB header */
    ret += (r = lyb_print_header(out));
    if (r < 0) {
        rc = EXIT_FAILURE;
        goto finish;
    }

    /* all used models */
    ret += (r = lyb_print_data_models(out, root, &lybs));
    if (r < 0) {
        rc = EXIT_FAILURE;
        goto finish;
    }

    LY_TREE_FOR(root, root) {
        /* do not reuse sibling hash tables from different modules */
        if (lyd_node_module(root) != prev_mod) {
            top_sibling_ht = NULL;
            prev_mod = lyd_node_module(root);
        }

        ret += (r = lyb_print_subtree(out, root, &top_sibling_ht, &lybs, 1));
        if (r < 0) {
            rc = EXIT_FAILURE;
            goto finish;
        }

        if (!(options & LYP_WITHSIBLINGS)) {
            break;
        }
    }

    /* ending zero byte */
    ret += (r = lyb_write(out, &zero, sizeof zero, &lybs));
    if (r < 0) {
        rc = EXIT_FAILURE;
    }

finish:
    free(lybs.written);
    free(lybs.position);
    free(lybs.inner_chunks);
    for (r = 0; r < lybs.sib_ht_count; ++r) {
        lyht_free(lybs.sib_ht[r].ht);
    }
    free(lybs.sib_ht);

    return rc;
}